

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_indirect_string.cpp
# Opt level: O0

void __thiscall
IndirectStringAdder_NewString_Test::TestBody(IndirectStringAdder_NewString_Test *this)

{
  bool bVar1;
  pointer pvVar2;
  char *pcVar3;
  element_type *peVar4;
  database *db;
  char *in_R9;
  sstring_view<const_char_*> sVar5;
  AssertHelper local_6c0;
  Message local_6b8;
  sstring_view<const_char_*> local_6b0;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_6a0;
  raw_sstring_view local_698;
  undefined1 local_688 [8];
  AssertionResult gtest_ar_4;
  shared_sstring_view owner;
  AssertHelper local_658;
  Message local_650;
  const_iterator local_648;
  undefined1 local_558 [8];
  AssertionResult gtest_ar_3;
  indirect_string local_540;
  undefined1 local_528 [8];
  const_iterator pos;
  raw_sstring_view sstring;
  shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
  name_index_1;
  Message local_410;
  unsigned_long local_408;
  uint64_t local_400;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_3c8;
  Message local_3c0;
  bool local_3b1;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar__1;
  Message local_398;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_390;
  raw_sstring_view local_388;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_1;
  shared_sstring_view res2_owner;
  undefined1 local_348 [8];
  pair<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>,_bool>
  res2;
  AssertHelper local_230;
  Message local_228;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_;
  Message local_208;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_200;
  raw_sstring_view local_1f8;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar;
  shared_sstring_view res1_owner;
  undefined1 local_1b8 [8];
  pair<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>,_bool>
  res1;
  raw_sstring_view sstring2;
  raw_sstring_view sstring1;
  indirect_string_adder adder;
  shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
  name_index;
  unique_lock<mock_mutex> local_68;
  undefined1 local_58 [8];
  transaction<std::unique_lock<mock_mutex>_> transaction;
  mock_mutex mutex;
  char *str;
  IndirectStringAdder_NewString_Test *this_local;
  
  std::unique_lock<mock_mutex>::unique_lock(&local_68,(mutex_type *)&transaction.lock_.field_0xf);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_58,
          &(this->super_IndirectStringAdder).db_,&local_68);
  std::unique_lock<mock_mutex>::~unique_lock(&local_68);
  pstore::index::
  get_index<(pstore::trailer::indices)3,pstore::database,pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>>
            ((index *)&adder.views_.
                       super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
             &(this->super_IndirectStringAdder).db_,true);
  pstore::indirect_string_adder::indirect_string_adder((indirect_string_adder *)&sstring1.size_);
  sVar5 = pstore::make_sstring_view("string");
  sstring1.ptr_ = (char *)sVar5.size_;
  sstring2.size_ = (size_type)sVar5.ptr_;
  sVar5 = pstore::make_sstring_view("string");
  sstring2.ptr_ = (char *)sVar5.size_;
  res1._240_8_ = sVar5.ptr_;
  pstore::gsl::not_null<const_pstore::sstring_view<const_char_*>_*>::not_null
            ((not_null<const_pstore::sstring_view<const_char_*>_*> *)&res1_owner.size_,
             (sstring_view<const_char_*> *)&sstring2.size_);
  pstore::indirect_string_adder::
  add<pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>>
            ((pair<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>,_bool>
              *)local_1b8,(indirect_string_adder *)&sstring1.size_,(transaction_base *)local_58,
             (shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
              *)&adder.views_.
                 super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (not_null<const_pstore::sstring_view<const_char_*>_*>)res1_owner.size_);
  pstore::sstring_view<std::shared_ptr<const_char>_>::sstring_view
            ((sstring_view<std::shared_ptr<const_char>_> *)&gtest_ar.message_);
  pvVar2 = pstore::index::
           hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
           ::
           set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>
           ::operator->((set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>
                         *)local_1b8);
  pstore::gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::not_null
            (&local_200,(sstring_view<std::shared_ptr<const_char>_> *)&gtest_ar.message_);
  local_1f8 = pstore::indirect_string::as_string_view(pvVar2,local_200);
  testing::internal::EqHelper::
  Compare<pstore::sstring_view<const_char_*>,_pstore::sstring_view<const_char_*>,_nullptr>
            ((EqHelper *)local_1e8,"res1.first->as_string_view (&res1_owner)","sstring1",&local_1f8,
             (sstring_view<const_char_*> *)&sstring2.size_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_indirect_string.cpp"
               ,0xda,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_220,(bool *)&res1.first.it_.pos_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&res2.second,(internal *)local_220,(AssertionResult *)"res1.second","false"
               ,"true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_indirect_string.cpp"
               ,0xdb,pcVar3);
    testing::internal::AssertHelper::operator=(&local_230,&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    std::__cxx11::string::~string((string *)&res2.second);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  pstore::sstring_view<std::shared_ptr<const_char>_>::~sstring_view
            ((sstring_view<std::shared_ptr<const_char>_> *)&gtest_ar.message_);
  std::
  pair<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>,_bool>
  ::~pair((pair<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>,_bool>
           *)local_1b8);
  pstore::gsl::not_null<const_pstore::sstring_view<const_char_*>_*>::not_null
            ((not_null<const_pstore::sstring_view<const_char_*>_*> *)&res2_owner.size_,
             (sstring_view<const_char_*> *)&res1.second);
  pstore::indirect_string_adder::
  add<pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>>
            ((pair<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>,_bool>
              *)local_348,(indirect_string_adder *)&sstring1.size_,(transaction_base *)local_58,
             (shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
              *)&adder.views_.
                 super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (not_null<const_pstore::sstring_view<const_char_*>_*>)res2_owner.size_);
  pstore::sstring_view<std::shared_ptr<const_char>_>::sstring_view
            ((sstring_view<std::shared_ptr<const_char>_> *)&gtest_ar_1.message_);
  pvVar2 = pstore::index::
           hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
           ::
           set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>
           ::operator->((set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>
                         *)local_348);
  pstore::gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::not_null
            (&local_390,(sstring_view<std::shared_ptr<const_char>_> *)&gtest_ar_1.message_);
  local_388 = pstore::indirect_string::as_string_view(pvVar2,local_390);
  testing::internal::EqHelper::
  Compare<pstore::sstring_view<const_char_*>,_pstore::sstring_view<const_char_*>,_nullptr>
            ((EqHelper *)local_378,"res2.first->as_string_view (&res2_owner)","sstring1",&local_388,
             (sstring_view<const_char_*> *)&sstring2.size_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(&local_398);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_indirect_string.cpp"
               ,0xe3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_398);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  local_3b1 = (bool)(~(byte)res2.first.it_.pos_._M_t.
                            super___uniq_ptr_impl<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
                            .
                            super__Head_base<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
                            ._M_head_impl & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3b0,&local_3b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
  if (!bVar1) {
    testing::Message::Message(&local_3c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_3b0,(AssertionResult *)"res2.second"
               ,"true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_indirect_string.cpp"
               ,0xe4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper(&local_3c8);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_3c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
  pstore::sstring_view<std::shared_ptr<const_char>_>::~sstring_view
            ((sstring_view<std::shared_ptr<const_char>_> *)&gtest_ar_1.message_);
  std::
  pair<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>,_bool>
  ::~pair((pair<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>,_bool>
           *)local_348);
  local_400 = pstore::transaction_base::size((transaction_base *)local_58);
  local_408 = 8;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_3f8,"transaction.size ()","sizeof (pstore::address)",&local_400,
             &local_408);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
  if (!bVar1) {
    testing::Message::Message(&local_410);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &name_index_1.
                super___shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_indirect_string.cpp"
               ,0xe6,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &name_index_1.
                super___shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,&local_410);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &name_index_1.
                super___shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    testing::Message::~Message(&local_410);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
  pstore::indirect_string_adder::flush
            ((indirect_string_adder *)&sstring1.size_,(transaction_base *)local_58);
  pstore::indirect_string_adder::~indirect_string_adder((indirect_string_adder *)&sstring1.size_);
  std::
  shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
  ::~shared_ptr((shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
                 *)&adder.views_.
                    super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pstore::transaction_base::commit((transaction_base *)local_58);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_58);
  pstore::index::
  get_index<(pstore::trailer::indices)3,pstore::database,pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>>
            ((index *)&sstring.size_,&(this->super_IndirectStringAdder).db_,true);
  sVar5 = pstore::make_sstring_view("string");
  sstring.ptr_ = (char *)sVar5.size_;
  pos.it_.pos_._M_t.
  super___uniq_ptr_impl<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
  .
  super__Head_base<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>,_true,_true>
        )sVar5.ptr_;
  peVar4 = std::
           __shared_ptr_access<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&sstring.size_);
  db = &(this->super_IndirectStringAdder).db_;
  pstore::gsl::not_null<const_pstore::sstring_view<const_char_*>_*>::not_null
            ((not_null<const_pstore::sstring_view<const_char_*>_*> *)&gtest_ar_3.message_,
             (sstring_view<const_char_*> *)&pos.it_.pos_);
  pstore::indirect_string::indirect_string
            (&local_540,db,
             (not_null<const_pstore::sstring_view<const_char_*>_*>)
             gtest_ar_3.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  pstore::index::
  hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>
  ::find<pstore::indirect_string,void>((const_iterator *)local_528,peVar4,db,&local_540);
  peVar4 = std::
           __shared_ptr_access<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&sstring.size_);
  pstore::index::
  hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
  ::cend(&local_648,peVar4,&(this->super_IndirectStringAdder).db_);
  testing::internal::
  CmpHelperNE<pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>::set_iterator<pstore::index::hamt_map<pstore::indirect_string,pstore::index::details::empty_class,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>::iterator_base<true>>,pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>::set_iterator<pstore::index::hamt_map<pstore::indirect_string,pstore::index::details::empty_class,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>::iterator_base<true>>>
            ((internal *)local_558,"pos","name_index->cend (db_)",
             (set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>
              *)local_528,&local_648);
  pstore::index::
  hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
  ::
  set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>
  ::~set_iterator(&local_648);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_558);
  if (!bVar1) {
    testing::Message::Message(&local_650);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_558);
    testing::internal::AssertHelper::AssertHelper
              (&local_658,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_indirect_string.cpp"
               ,0xef,pcVar3);
    testing::internal::AssertHelper::operator=(&local_658,&local_650);
    testing::internal::AssertHelper::~AssertHelper(&local_658);
    testing::Message::~Message(&local_650);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_558);
  if (bVar1) {
    pstore::sstring_view<std::shared_ptr<const_char>_>::sstring_view
              ((sstring_view<std::shared_ptr<const_char>_> *)&gtest_ar_4.message_);
    pvVar2 = pstore::index::
             hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
             ::
             set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>
             ::operator->((set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>
                           *)local_528);
    pstore::gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::not_null
              (&local_6a0,(sstring_view<std::shared_ptr<const_char>_> *)&gtest_ar_4.message_);
    local_698 = pstore::indirect_string::as_string_view(pvVar2,local_6a0);
    local_6b0 = pstore::make_sstring_view("string");
    testing::internal::EqHelper::
    Compare<pstore::sstring_view<const_char_*>,_pstore::sstring_view<const_char_*>,_nullptr>
              ((EqHelper *)local_688,"pos->as_string_view (&owner)",
               "pstore::make_sstring_view (str)",&local_698,&local_6b0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_688);
    if (!bVar1) {
      testing::Message::Message(&local_6b8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_688);
      testing::internal::AssertHelper::AssertHelper
                (&local_6c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_indirect_string.cpp"
                 ,0xf2,pcVar3);
      testing::internal::AssertHelper::operator=(&local_6c0,&local_6b8);
      testing::internal::AssertHelper::~AssertHelper(&local_6c0);
      testing::Message::~Message(&local_6b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_688);
    pstore::sstring_view<std::shared_ptr<const_char>_>::~sstring_view
              ((sstring_view<std::shared_ptr<const_char>_> *)&gtest_ar_4.message_);
  }
  pstore::index::
  hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
  ::
  set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>
  ::~set_iterator((set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>
                   *)local_528);
  std::
  shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
  ::~shared_ptr((shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
                 *)&sstring.size_);
  return;
}

Assistant:

TEST_F (IndirectStringAdder, NewString) {
    constexpr auto str = "string";
    {
        mock_mutex mutex;
        auto transaction = begin (db_, std::unique_lock<mock_mutex>{mutex});
        {
            auto const name_index = pstore::index::get_index<pstore::trailer::indices::name> (db_);

            // Use the string adder to insert a string into the index and flush it to the store.
            pstore::indirect_string_adder adder;
            auto const sstring1 = pstore::make_sstring_view (str);
            auto const sstring2 = pstore::make_sstring_view (str);
            {
                std::pair<pstore::index::name_index::iterator, bool> res1 =
                    adder.add (transaction, name_index, &sstring1);
                pstore::shared_sstring_view res1_owner;
                EXPECT_EQ (res1.first->as_string_view (&res1_owner), sstring1);
                EXPECT_TRUE (res1.second);
            }
            {
                // adding the same string again should result in nothing being written.
                std::pair<pstore::index::name_index::iterator, bool> const res2 =
                    adder.add (transaction, name_index, &sstring2);

                pstore::shared_sstring_view res2_owner;
                EXPECT_EQ (res2.first->as_string_view (&res2_owner), sstring1);
                EXPECT_FALSE (res2.second);
            }
            EXPECT_EQ (transaction.size (), sizeof (pstore::address));
            adder.flush (transaction);
        }
        transaction.commit ();
    }
    {
        auto const name_index = pstore::index::get_index<pstore::trailer::indices::name> (db_);
        auto const sstring = pstore::make_sstring_view (str);
        auto const pos = name_index->find (db_, pstore::indirect_string{db_, &sstring});
        ASSERT_NE (pos, name_index->cend (db_));

        pstore::shared_sstring_view owner;
        EXPECT_EQ (pos->as_string_view (&owner), pstore::make_sstring_view (str));
    }
}